

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void dense_rankValueFunc(sqlite3_context *pCtx)

{
  long *plVar1;
  long iVal;
  
  plVar1 = (long *)sqlite3_aggregate_context(pCtx,0x18);
  if (plVar1 != (long *)0x0) {
    iVal = *plVar1;
    if (plVar1[1] != 0) {
      iVal = iVal + 1;
      *plVar1 = iVal;
      plVar1[1] = 0;
    }
    sqlite3_result_int64(pCtx,iVal);
    return;
  }
  return;
}

Assistant:

static void dense_rankValueFunc(sqlite3_context *pCtx){
  struct CallCount *p;
  p = (struct CallCount*)sqlite3_aggregate_context(pCtx, sizeof(*p));
  if( p ){
    if( p->nStep ){
      p->nValue++;
      p->nStep = 0;
    }
    sqlite3_result_int64(pCtx, p->nValue);
  }
}